

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

bool __thiscall Minisat::Solver::litRedundant(Solver *this,Lit p)

{
  uint uVar1;
  vec<Minisat::Solver::ShrinkStackElem,_int> *pvVar2;
  int iVar3;
  CRef CVar4;
  uint uVar5;
  Size SVar6;
  char *pcVar7;
  Lit *pLVar8;
  ShrinkStackElem *pSVar9;
  bool bVar10;
  ShrinkStackElem local_7c;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int i_1;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  Lit local_48;
  uint local_44;
  Lit l;
  uint32_t i;
  vec<Minisat::Solver::ShrinkStackElem,_int> *stack;
  Clause *local_30;
  Clause *c;
  Solver *this_local;
  Lit p_local;
  
  this_local._0_4_ = p.x;
  iVar3 = var(p);
  pcVar7 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                     (&(this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,iVar3);
  bVar10 = true;
  if (*pcVar7 != '\0') {
    iVar3 = var(this_local._0_4_);
    pcVar7 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                       (&(this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,iVar3);
    bVar10 = *pcVar7 == '\x01';
  }
  if (!bVar10) {
    __assert_fail("seen[var(p)] == seen_undef || seen[var(p)] == seen_source",
                  "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/core/Solver.cc"
                  ,0x187,"bool Minisat::Solver::litRedundant(Lit)");
  }
  iVar3 = var(this_local._0_4_);
  CVar4 = reason(this,iVar3);
  if (CVar4 == 0xffffffff) {
    __assert_fail("reason(var(p)) != CRef_Undef",
                  "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/core/Solver.cc"
                  ,0x188,"bool Minisat::Solver::litRedundant(Lit)");
  }
  iVar3 = var(this_local._0_4_);
  CVar4 = reason(this,iVar3);
  local_30 = ClauseAllocator::operator[](&this->ca,CVar4);
  _l = &this->analyze_stack;
  vec<Minisat::Solver::ShrinkStackElem,_int>::clear(_l,false);
  local_44 = 1;
  do {
    uVar1 = local_44;
    uVar5 = Clause::size(local_30);
    if (uVar1 < uVar5) {
      pLVar8 = Clause::operator[](local_30,local_44);
      local_4c = pLVar8->x;
      local_48.x = local_4c;
      iVar3 = var((Lit)local_4c);
      iVar3 = level(this,iVar3);
      if (iVar3 != 0) {
        local_50 = local_48.x;
        iVar3 = var(local_48);
        pcVar7 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                           (&(this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,
                            iVar3);
        if (*pcVar7 != '\x01') {
          local_54 = local_48.x;
          iVar3 = var(local_48);
          pcVar7 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                             (&(this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,
                              iVar3);
          if (*pcVar7 != '\x02') {
            local_58 = local_48.x;
            iVar3 = var(local_48);
            CVar4 = reason(this,iVar3);
            if (CVar4 == 0xffffffff) {
LAB_00114332:
              pvVar2 = _l;
              local_68 = this_local._0_4_;
              ShrinkStackElem::ShrinkStackElem((ShrinkStackElem *)&i_1,0,this_local._0_4_);
              vec<Minisat::Solver::ShrinkStackElem,_int>::push(pvVar2,(ShrinkStackElem *)&i_1);
              for (local_6c = 0; iVar3 = local_6c,
                  SVar6 = vec<Minisat::Solver::ShrinkStackElem,_int>::size(_l), iVar3 < SVar6;
                  local_6c = local_6c + 1) {
                pSVar9 = vec<Minisat::Solver::ShrinkStackElem,_int>::operator[](_l,local_6c);
                local_70 = (pSVar9->l).x;
                iVar3 = var((Lit)local_70);
                pcVar7 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                                   (&(this->seen).
                                     super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,iVar3);
                if (*pcVar7 == '\0') {
                  pSVar9 = vec<Minisat::Solver::ShrinkStackElem,_int>::operator[](_l,local_6c);
                  local_74 = (pSVar9->l).x;
                  iVar3 = var((Lit)local_74);
                  pcVar7 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                                     (&(this->seen).
                                       super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,iVar3)
                  ;
                  *pcVar7 = '\x03';
                  pSVar9 = vec<Minisat::Solver::ShrinkStackElem,_int>::operator[](_l,local_6c);
                  vec<Minisat::Lit,_int>::push(&this->analyze_toclear,&pSVar9->l);
                }
              }
              return false;
            }
            local_5c = local_48.x;
            iVar3 = var(local_48);
            pcVar7 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                               (&(this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>
                                ,iVar3);
            pvVar2 = _l;
            if (*pcVar7 == '\x03') goto LAB_00114332;
            ShrinkStackElem::ShrinkStackElem(&local_7c,local_44,this_local._0_4_);
            vec<Minisat::Solver::ShrinkStackElem,_int>::push(pvVar2,&local_7c);
            local_44 = 0;
            this_local._0_4_ = local_48.x;
            iVar3 = var(local_48);
            CVar4 = reason(this,iVar3);
            local_30 = ClauseAllocator::operator[](&this->ca,CVar4);
          }
        }
      }
    }
    else {
      iVar3 = var(this_local._0_4_);
      pcVar7 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                         (&(this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,iVar3
                         );
      if (*pcVar7 == '\0') {
        iVar3 = var(this_local._0_4_);
        pcVar7 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                           (&(this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,
                            iVar3);
        *pcVar7 = '\x02';
        vec<Minisat::Lit,_int>::push(&this->analyze_toclear,(Lit *)&this_local);
      }
      SVar6 = vec<Minisat::Solver::ShrinkStackElem,_int>::size(_l);
      if (SVar6 == 0) {
        return true;
      }
      pSVar9 = vec<Minisat::Solver::ShrinkStackElem,_int>::last(_l);
      local_44 = pSVar9->i;
      pSVar9 = vec<Minisat::Solver::ShrinkStackElem,_int>::last(_l);
      this_local._0_4_ = (pSVar9->l).x;
      iVar3 = var(this_local._0_4_);
      CVar4 = reason(this,iVar3);
      local_30 = ClauseAllocator::operator[](&this->ca,CVar4);
      vec<Minisat::Solver::ShrinkStackElem,_int>::pop(_l);
    }
    local_44 = local_44 + 1;
  } while( true );
}

Assistant:

bool Solver::litRedundant(Lit p)
{
    enum { seen_undef = 0, seen_source = 1, seen_removable = 2, seen_failed = 3 };
    assert(seen[var(p)] == seen_undef || seen[var(p)] == seen_source);
    assert(reason(var(p)) != CRef_Undef);

    Clause*               c     = &ca[reason(var(p))];
    vec<ShrinkStackElem>& stack = analyze_stack;
    stack.clear();

    for (uint32_t i = 1; ; i++){
        if (i < (uint32_t)c->size()){
            // Checking 'p'-parents 'l':
            Lit l = (*c)[i];
            
            // Variable at level 0 or previously removable:
            if (level(var(l)) == 0 || seen[var(l)] == seen_source || seen[var(l)] == seen_removable){
                continue; }
            
            // Check variable can not be removed for some local reason:
            if (reason(var(l)) == CRef_Undef || seen[var(l)] == seen_failed){
                stack.push(ShrinkStackElem(0, p));
                for (int i = 0; i < stack.size(); i++)
                    if (seen[var(stack[i].l)] == seen_undef){
                        seen[var(stack[i].l)] = seen_failed;
                        analyze_toclear.push(stack[i].l);
                    }
                    
                return false;
            }

            // Recursively check 'l':
            stack.push(ShrinkStackElem(i, p));
            i  = 0;
            p  = l;
            c  = &ca[reason(var(p))];
        }else{
            // Finished with current element 'p' and reason 'c':
            if (seen[var(p)] == seen_undef){
                seen[var(p)] = seen_removable;
                analyze_toclear.push(p);
            }

            // Terminate with success if stack is empty:
            if (stack.size() == 0) break;
            
            // Continue with top element on stack:
            i  = stack.last().i;
            p  = stack.last().l;
            c  = &ca[reason(var(p))];

            stack.pop();
        }
    }

    return true;
}